

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerpool.c
# Opt level: O0

void workerpool_destroy(workerpool_t *wp)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  workerpool_t *wp_local;
  
  if (wp != (workerpool_t *)0x0) {
    if (1 < wp->nthreads) {
      for (local_14 = 0; local_14 < wp->nthreads; local_14 = local_14 + 1) {
        workerpool_add_task(wp,(_func_void_void_ptr *)0x0,(void *)0x0);
      }
      pthread_mutex_lock((pthread_mutex_t *)&wp->mutex);
      pthread_cond_broadcast((pthread_cond_t *)&wp->startcond);
      pthread_mutex_unlock((pthread_mutex_t *)&wp->mutex);
      for (local_18 = 0; local_18 < wp->nthreads; local_18 = local_18 + 1) {
        pthread_join(wp->threads[local_18],(void **)0x0);
      }
      pthread_mutex_destroy((pthread_mutex_t *)&wp->mutex);
      pthread_cond_destroy((pthread_cond_t *)&wp->startcond);
      pthread_cond_destroy((pthread_cond_t *)&wp->endcond);
      free(wp->threads);
    }
    zarray_destroy(wp->tasks);
    free(wp);
  }
  return;
}

Assistant:

void workerpool_destroy(workerpool_t *wp)
{
    if (wp == NULL)
        return;

    // force all worker threads to exit.
    if (wp->nthreads > 1) {
        for (int i = 0; i < wp->nthreads; i++)
            workerpool_add_task(wp, NULL, NULL);

        pthread_mutex_lock(&wp->mutex);
        pthread_cond_broadcast(&wp->startcond);
        pthread_mutex_unlock(&wp->mutex);

        for (int i = 0; i < wp->nthreads; i++)
            pthread_join(wp->threads[i], NULL);

        pthread_mutex_destroy(&wp->mutex);
        pthread_cond_destroy(&wp->startcond);
        pthread_cond_destroy(&wp->endcond);
        free(wp->threads);
    }

    zarray_destroy(wp->tasks);
    free(wp);
}